

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O0

void __thiscall depspawn::internal::Workitem::Workitem(Workitem *this,arg_info *iargs,int nargs)

{
  undefined1 in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  bool __i_00;
  __integral_type_conflict __i;
  atomic<int> *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__Workitem_00140900;
  *(undefined2 *)(in_RDI + 1) = 0;
  *(undefined2 *)((long)in_RDI + 10) = 0;
  __i_00 = SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0);
  std::atomic_flag::atomic_flag((atomic_flag *)in_stack_ffffffffffffffc0,__i_00);
  std::atomic<char>::atomic((atomic<char> *)in_stack_ffffffffffffffc0,__i_00);
  *(undefined1 *)((long)in_RDI + 0xe) = in_DL;
  in_RDI[2] = in_RSI;
  in_RDI[3] = 0;
  in_RDI[4] = *(undefined8 *)(*in_FS_OFFSET + -8);
  __i = (__integral_type_conflict)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  std::atomic<int>::atomic(in_stack_ffffffffffffffc0,__i);
  std::atomic<int>::atomic(in_stack_ffffffffffffffc0,__i);
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  if (in_RDI[4] != 0) {
    LOCK();
    *(int *)(in_RDI[4] + 0x2c) = *(int *)(in_RDI[4] + 0x2c) + 1;
    UNLOCK();
  }
  return;
}

Assistant:

Workitem::Workitem(arg_info *iargs, int nargs) :
    status(Status_t::Filling), optFlags_(0),
    guard_(0), nargs_(static_cast<char>(nargs)),
    args(iargs), next(nullptr), father(enum_thr_spec_father),
    ndependencies(0), nchildren(1),
    task(nullptr), deps(nullptr), lastdep(nullptr)
    {
      if(father)
        father->nchildren.fetch_add(1);
    }